

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::load(SceneGraph *this,FileName *filename,bool singleObject)

{
  __type _Var1;
  runtime_error *this_00;
  allocator local_b9;
  string local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  FileName::ext_abi_cxx11_(&local_b8,filename);
  toLowerCase((string *)&local_98.field_1,&local_b8);
  std::__cxx11::string::string((string *)&local_50,"obj",&local_b9);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_98.field_1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98.field_1);
  std::__cxx11::string::~string((string *)&local_b8);
  if (_Var1) {
    loadOBJ((embree *)this,filename,false,singleObject);
  }
  else {
    FileName::ext_abi_cxx11_(&local_b8,filename);
    toLowerCase((string *)&local_98.field_1,&local_b8);
    std::__cxx11::string::string((string *)&local_50,"ply",&local_b9);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_98.field_1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98.field_1);
    std::__cxx11::string::~string((string *)&local_b8);
    if (_Var1) {
      loadPLY(this,filename);
    }
    else {
      FileName::ext_abi_cxx11_(&local_b8,filename);
      toLowerCase((string *)&local_98.field_1,&local_b8);
      std::__cxx11::string::string((string *)&local_50,"xml",&local_b9);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_98.field_1,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98.field_1);
      std::__cxx11::string::~string((string *)&local_b8);
      if (_Var1) {
        local_98._0_8_ = 0x3f800000;
        local_98._8_8_ = 0;
        local_88 = 0x3f80000000000000;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0x3f800000;
        local_68 = 0;
        uStack_60 = 0;
        loadXML(this,filename,(AffineSpace3fa *)&local_98.field_1);
      }
      else {
        FileName::ext_abi_cxx11_(&local_b8,filename);
        toLowerCase((string *)&local_98.field_1,&local_b8);
        std::__cxx11::string::string((string *)&local_50,"scn",&local_b9);
        _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_98.field_1,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_98.field_1);
        std::__cxx11::string::~string((string *)&local_b8);
        if (!_Var1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          FileName::ext_abi_cxx11_(&local_b8,filename);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_98.field_1,"unknown scene format: ",&local_b8);
          std::runtime_error::runtime_error(this_00,(string *)&local_98.field_1);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_98._0_8_ = 0x3f800000;
        local_98._8_8_ = 0;
        local_88 = 0x3f80000000000000;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0x3f800000;
        local_68 = 0;
        uStack_60 = 0;
        loadCorona(this,filename,(AffineSpace3fa *)&local_98.field_1);
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::load(const FileName& filename, const bool singleObject)
  {
    if      (toLowerCase(filename.ext()) == std::string("obj" )) return loadOBJ(filename, false, singleObject);
    else if (toLowerCase(filename.ext()) == std::string("ply" )) return loadPLY(filename);
    else if (toLowerCase(filename.ext()) == std::string("xml" )) return loadXML(filename);
    else if (toLowerCase(filename.ext()) == std::string("scn" )) return loadCorona(filename);
    else throw std::runtime_error("unknown scene format: " + filename.ext());
  }